

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::setAngularLowerLimit
          (btGeneric6DofSpring2Constraint *this,btVector3 *angularLower)

{
  btRotationalLimitMotor2 *pbVar1;
  int i;
  long lVar2;
  btScalar bVar3;
  
  pbVar1 = this->m_angularLimits;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    bVar3 = btNormalizeAngle(angularLower->m_floats[lVar2]);
    pbVar1->m_loLimit = bVar3;
    pbVar1 = pbVar1 + 1;
  }
  return;
}

Assistant:

void setAngularLowerLimit(const btVector3& angularLower)
	{
		for(int i = 0; i < 3; i++) 
			m_angularLimits[i].m_loLimit = btNormalizeAngle(angularLower[i]);
	}